

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cc
# Opt level: O1

bool __thiscall tt::net::TimerNode::isValid(TimerNode *this)

{
  ulong uVar1;
  undefined1 local_28 [8];
  timeval now;
  
  gettimeofday((timeval *)local_28,(__timezone_ptr_t)0x0);
  uVar1 = now.tv_sec / 1000 + ((long)local_28 % 10000) * 1000;
  if (this->expiredTime_ <= uVar1) {
    this->deleted_ = true;
  }
  return uVar1 < this->expiredTime_;
}

Assistant:

bool TimerNode::isValid() {
  struct timeval now;
  gettimeofday(&now, NULL);
  size_t temp = (((now.tv_sec % 10000) * 1000) + (now.tv_usec / 1000));
  if (temp < expiredTime_)
    return true;
  else {
    this->setDeleted();
    return false;
  }
}